

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O1

bool __thiscall
Assimp::CalcTangentsProcess::ProcessMesh(CalcTangentsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiFace *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  aiVector3D *paVar6;
  bool bVar7;
  aiVector3D *__s;
  aiVector3D *__s_00;
  ulong uVar8;
  Base **ppBVar9;
  Logger *pLVar10;
  _func_int **pp_Var11;
  aiVector3D *paVar12;
  SpatialSort *this_00;
  aiVector3D *paVar13;
  ulong uVar14;
  aiVector3D *paVar15;
  aiMesh *pMesh_00;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined4 uVar19;
  float fVar20;
  float fVar21;
  undefined4 uVar22;
  _IEEESingle temp_1;
  float fVar23;
  float fVar24;
  _IEEESingle temp;
  undefined4 uVar25;
  float fVar26;
  undefined4 uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> closeVertices;
  uint idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  SpatialSort _vertexFinder;
  vector<bool,_std::allocator<bool>_> vertexDone;
  float local_2b0;
  uint local_2a0;
  float local_29c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  uint local_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  undefined4 uStack_260;
  undefined4 uStack_25c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  undefined1 local_238 [16];
  CalcTangentsProcess *local_220;
  aiMesh *local_218;
  SpatialSort *local_210;
  aiVector3D *local_208;
  uint local_1fc;
  aiVector3D *local_1f8;
  aiVector3D *local_1f0;
  ulong local_1e8;
  SpatialSort local_1e0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (pMesh->mTangents != (aiVector3D *)0x0) {
    return false;
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    pLVar10 = DefaultLogger::get();
    Logger::info(pLVar10,"Tangents are undefined for line and point meshes");
    return false;
  }
  if (pMesh->mNormals == (aiVector3D *)0x0) {
    pLVar10 = DefaultLogger::get();
    Logger::error(pLVar10,"Failed to compute tangents; need normals");
    return false;
  }
  if ((7 < (ulong)this->configSourceUV) ||
     (pMesh->mTextureCoords[this->configSourceUV] == (aiVector3D *)0x0)) {
    pLVar10 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[52]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [52])"Failed to compute tangents; need UV data in channel");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar10,(char *)CONCAT71(local_1e0.mPlaneNormal._1_7_,
                                           local_1e0.mPlaneNormal.x._0_1_));
    if ((vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_> *)
        CONCAT71(local_1e0.mPlaneNormal._1_7_,local_1e0.mPlaneNormal.x._0_1_) !=
        &local_1e0.mPositions) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1e0.mPlaneNormal._1_7_,local_1e0.mPlaneNormal.x._0_1_));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return false;
  }
  local_1e0.mPlaneNormal.x._0_1_ = 0;
  local_220 = this;
  local_1fc = meshIndex;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1a8,(ulong)pMesh->mNumVertices,
             (bool *)&local_1e0,(allocator_type *)&local_258);
  uVar2 = pMesh->mNumVertices;
  uVar8 = (ulong)uVar2;
  __s = (aiVector3D *)operator_new__(uVar8 * 0xc);
  if (uVar8 != 0) {
    memset(__s,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mTangents = __s;
  __s_00 = (aiVector3D *)operator_new__(uVar8 * 0xc);
  if (uVar2 != 0) {
    memset(__s_00,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mBitangents = __s_00;
  local_208 = pMesh->mNormals;
  local_218 = pMesh;
  if (pMesh->mNumFaces != 0) {
    local_1f8 = pMesh->mVertices;
    local_1f0 = pMesh->mTextureCoords[local_220->configSourceUV];
    uVar8 = 0;
    do {
      paVar1 = local_218->mFaces + uVar8;
      local_1e8 = uVar8;
      if (local_218->mFaces[uVar8].mNumIndices < 3) {
        if (paVar1->mNumIndices != 0) {
          uVar8 = 0;
          do {
            uVar2 = paVar1->mIndices[uVar8];
            *(ulong *)(local_1a8._0_8_ + (ulong)(uVar2 >> 6) * 8) =
                 *(ulong *)(local_1a8._0_8_ + (ulong)(uVar2 >> 6) * 8) | 1L << ((byte)uVar2 & 0x3f);
            __s[uVar2].x = NAN;
            __s[uVar2].y = NAN;
            __s[uVar2].z = NAN;
            __s_00[uVar2].x = NAN;
            __s_00[uVar2].y = NAN;
            __s_00[uVar2].z = NAN;
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumIndices);
        }
      }
      else {
        puVar5 = paVar1->mIndices;
        uVar2 = *puVar5;
        uVar3 = puVar5[1];
        uVar4 = puVar5[2];
        fVar16 = local_1f0[uVar3].x - local_1f0[uVar2].x;
        fVar28 = local_1f0[uVar3].y - local_1f0[uVar2].y;
        fVar18 = local_1f0[uVar4].x - local_1f0[uVar2].x;
        fVar21 = local_1f0[uVar4].y - local_1f0[uVar2].y;
        fVar24 = fVar16 * fVar21;
        fVar26 = fVar18 * fVar28;
        if ((fVar24 == fVar26) && (!NAN(fVar24) && !NAN(fVar26))) {
          fVar21 = 0.0;
          fVar18 = 1.0;
          fVar28 = 1.0;
          fVar16 = 0.0;
        }
        if (paVar1->mNumIndices != 0) {
          fVar23 = local_1f8[uVar3].x - local_1f8[uVar2].x;
          fVar20 = local_1f8[uVar3].y - local_1f8[uVar2].y;
          fVar17 = local_1f8[uVar3].z - local_1f8[uVar2].z;
          fVar29 = local_1f8[uVar4].x - local_1f8[uVar2].x;
          fVar30 = local_1f8[uVar4].y - local_1f8[uVar2].y;
          fVar31 = local_1f8[uVar4].z - local_1f8[uVar2].z;
          fVar24 = *(float *)(&DAT_0070575c + (ulong)(fVar26 - fVar24 < 0.0) * 4);
          local_2b0 = (fVar29 * fVar28 - fVar21 * fVar23) * fVar24;
          local_29c = (fVar30 * fVar28 - fVar21 * fVar20) * fVar24;
          fVar21 = (fVar28 * fVar31 - fVar21 * fVar17) * fVar24;
          fVar26 = (fVar29 * fVar16 - fVar23 * fVar18) * fVar24;
          fVar28 = (fVar30 * fVar16 - fVar20 * fVar18) * fVar24;
          local_210 = (SpatialSort *)
                      CONCAT44(local_210._4_4_,(fVar31 * fVar16 - fVar17 * fVar18) * fVar24);
          uVar8 = 0;
          do {
            uVar2 = paVar1->mIndices[uVar8];
            fVar16 = local_208[uVar2].x;
            fVar18 = local_208[uVar2].y;
            fVar24 = local_208[uVar2].z;
            fVar23 = fVar21 * fVar24 + local_2b0 * fVar16 + local_29c * fVar18;
            fVar20 = local_2b0 - fVar16 * fVar23;
            fVar17 = local_29c - fVar18 * fVar23;
            fVar29 = fVar21 - fVar23 * fVar24;
            fVar23 = fVar29 * fVar29 + fVar20 * fVar20 + fVar17 * fVar17;
            if (fVar23 < 0.0) {
              _local_268 = ZEXT416((uint)fVar20);
              local_278._0_4_ = fVar18;
              local_238._0_4_ = fVar24;
              local_1b8 = ZEXT416((uint)fVar17);
              fVar23 = sqrtf(fVar23);
              fVar17 = (float)local_1b8._0_4_;
              uVar22 = local_1b8._4_4_;
              fVar20 = (float)local_268._0_4_;
              uVar25 = local_268._4_4_;
              fVar24 = (float)local_238._0_4_;
              fVar18 = (float)local_278._0_4_;
            }
            else {
              fVar23 = SQRT(fVar23);
              uVar22 = 0;
              uVar25 = 0;
            }
            if (0.0 < fVar23) {
              fVar23 = 1.0 / fVar23;
              fVar20 = fVar20 * fVar23;
              fVar17 = fVar17 * fVar23;
              fVar29 = fVar29 * fVar23;
            }
            fVar30 = local_210._0_4_ * fVar24 + fVar26 * fVar16 + fVar28 * fVar18;
            fVar23 = fVar26 - fVar16 * fVar30;
            fVar16 = fVar28 - fVar18 * fVar30;
            fVar24 = local_210._0_4_ - fVar30 * fVar24;
            fVar18 = fVar24 * fVar24 + fVar23 * fVar23 + fVar16 * fVar16;
            if (fVar18 < 0.0) {
              local_268._4_4_ = fVar17;
              local_268._0_4_ = fVar20;
              uStack_260 = uVar25;
              uStack_25c = uVar22;
              _local_278 = ZEXT416((uint)fVar23);
              local_238 = ZEXT416((uint)fVar16);
              fVar18 = sqrtf(fVar18);
              fVar16 = (float)local_238._0_4_;
              uVar19 = local_238._4_4_;
              fVar20 = (float)local_268._0_4_;
              fVar17 = (float)local_268._4_4_;
              uVar25 = uStack_260;
              uVar22 = uStack_25c;
              fVar23 = (float)local_278._0_4_;
              uVar27 = local_278._4_4_;
            }
            else {
              fVar18 = SQRT(fVar18);
              uVar19 = 0;
              uVar27 = 0;
            }
            if (0.0 < fVar18) {
              fVar18 = 1.0 / fVar18;
              fVar23 = fVar23 * fVar18;
              fVar16 = fVar16 * fVar18;
              fVar24 = fVar24 * fVar18;
            }
            if ((((uint)ABS(fVar24) < 0x7f800000 && (uint)ABS(fVar23) < 0x7f800000) &&
                (uint)ABS(fVar16) < 0x7f800000) ==
                ((0x7f7fffff < (uint)ABS(fVar17) || 0x7f7fffff < (uint)ABS(fVar20)) ||
                0x7f7fffff < (uint)ABS(fVar29))) {
              paVar6 = local_208 + uVar2;
              fVar18 = paVar6->x;
              fVar30 = paVar6->z;
              if ((0x7f7fffff < (uint)ABS(fVar17) || 0x7f7fffff < (uint)ABS(fVar20)) ||
                  0x7f7fffff < (uint)ABS(fVar29)) {
                fVar20 = paVar6->y * fVar24 - fVar16 * fVar30;
                fVar17 = fVar30 * fVar23 - fVar24 * fVar18;
                fVar29 = fVar18 * fVar16 - paVar6->y * fVar23;
                fVar18 = fVar29 * fVar29 + fVar20 * fVar20 + fVar17 * fVar17;
                if (fVar18 < 0.0) {
                  _local_268 = ZEXT416((uint)fVar20);
                  local_278._4_4_ = fVar16;
                  local_278._0_4_ = fVar23;
                  fStack_270 = (float)uVar27;
                  fStack_26c = (float)uVar19;
                  local_238 = ZEXT416((uint)fVar17);
                  fVar18 = sqrtf(fVar18);
                  fVar20 = (float)local_268._0_4_;
                  fVar23 = (float)local_278._0_4_;
                  fVar16 = (float)local_278._4_4_;
                  fVar17 = (float)local_238._0_4_;
                }
                else {
                  fVar18 = SQRT(fVar18);
                }
                if (0.0 < fVar18) {
                  fVar18 = 1.0 / fVar18;
                  fVar20 = fVar20 * fVar18;
                  fVar17 = fVar17 * fVar18;
                  fVar29 = fVar29 * fVar18;
                }
              }
              else {
                fVar23 = fVar17 * fVar30 - paVar6->y * fVar29;
                fVar16 = fVar29 * fVar18 - fVar30 * fVar20;
                fVar24 = paVar6->y * fVar20 - fVar18 * fVar17;
                fVar18 = fVar24 * fVar24 + fVar23 * fVar23 + fVar16 * fVar16;
                if (fVar18 < 0.0) {
                  local_268._4_4_ = fVar17;
                  local_268._0_4_ = fVar20;
                  uStack_260 = uVar25;
                  uStack_25c = uVar22;
                  local_278._4_4_ = fVar17;
                  local_278._0_4_ = fVar23;
                  fStack_270 = fVar17;
                  fStack_26c = fVar17;
                  local_238 = ZEXT416((uint)fVar16);
                  fVar18 = sqrtf(fVar18);
                  fVar16 = (float)local_238._0_4_;
                  fVar20 = (float)local_268._0_4_;
                  fVar17 = (float)local_268._4_4_;
                  fVar23 = (float)local_278._0_4_;
                }
                else {
                  fVar18 = SQRT(fVar18);
                }
                if (0.0 < fVar18) {
                  fVar18 = 1.0 / fVar18;
                  fVar23 = fVar23 * fVar18;
                  fVar16 = fVar16 * fVar18;
                  fVar24 = fVar24 * fVar18;
                }
              }
            }
            __s[uVar2].x = fVar20;
            __s[uVar2].y = fVar17;
            __s[uVar2].z = fVar29;
            __s_00[uVar2].x = fVar23;
            __s_00[uVar2].y = fVar16;
            __s_00[uVar2].z = fVar24;
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumIndices);
        }
      }
      uVar8 = local_1e8 + 1;
    } while (uVar8 < local_218->mNumFaces);
  }
  pMesh_00 = local_218;
  SpatialSort::SpatialSort(&local_1e0);
  list = &((local_220->super_BaseProcess).shared)->pmap;
  if (list != (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
               *)0x0) {
    local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ppBVar9 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                        (list,"$Spat",(Base **)&local_258);
    if (*ppBVar9 == (Base *)0x0) {
      pp_Var11 = (_func_int **)0x0;
    }
    else {
      pp_Var11 = (*ppBVar9)[1]._vptr_Base;
    }
    if (pp_Var11 != (_func_int **)0x0) {
      this_00 = (SpatialSort *)(*pp_Var11 + (ulong)local_1fc * 0x30);
      local_2b0 = *(float *)(*pp_Var11 + (ulong)local_1fc * 0x30 + 0x28);
      goto LAB_003b58ce;
    }
  }
  this_00 = (SpatialSort *)0x0;
LAB_003b58ce:
  if (this_00 == (SpatialSort *)0x0) {
    this_00 = &local_1e0;
    SpatialSort::Fill(this_00,pMesh_00->mVertices,pMesh_00->mNumVertices,0xc,true);
    local_2b0 = ComputePositionEpsilon(pMesh_00);
  }
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar8 = 0;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210 = this_00;
  fVar16 = cosf(local_220->configMaxAngle);
  local_268._0_4_ = fVar16;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_2a0 = 0;
  if (pMesh_00->mNumVertices != 0) {
    do {
      if ((*(ulong *)(local_1a8._0_8_ + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) == 0) {
        paVar6 = pMesh_00->mVertices;
        paVar15 = pMesh_00->mNormals + uVar8;
        paVar13 = pMesh_00->mTangents + uVar8;
        paVar12 = pMesh_00->mBitangents + uVar8;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_298,0);
        SpatialSort::FindPositions(local_210,paVar6 + uVar8,local_2b0,&local_258);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&local_298,
                   ((long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) + 5);
        if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_298,
                     (iterator)
                     local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_2a0);
        }
        else {
          *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2a0;
          local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar8 = 0;
          uVar14 = 1;
          do {
            local_27c = local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8];
            uVar8 = (ulong)local_27c;
            if (((((*(ulong *)(local_1a8._0_8_ + (ulong)(local_27c >> 6) * 8) >> (uVar8 & 0x3f) & 1)
                   == 0) &&
                 (0.9999 <= local_208[uVar8].z * paVar15->z +
                            local_208[uVar8].x * paVar15->x + local_208[uVar8].y * paVar15->y)) &&
                ((float)local_268._0_4_ <=
                 __s[uVar8].z * paVar13->z + __s[uVar8].x * paVar13->x + __s[uVar8].y * paVar13->y))
               && ((float)local_268._0_4_ <=
                   __s_00[uVar8].z * paVar12->z +
                   __s_00[uVar8].x * paVar12->x + __s_00[uVar8].y * paVar12->y)) {
              if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_298,
                           (iterator)
                           local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_27c);
              }
              else {
                *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_27c;
                local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              *(ulong *)(local_1a8._0_8_ + (ulong)(local_27c >> 6) * 8) =
                   *(ulong *)(local_1a8._0_8_ + (ulong)(local_27c >> 6) * 8) |
                   1L << ((byte)local_27c & 0x3f);
            }
            bVar7 = uVar14 < (ulong)((long)local_258.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_258.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2);
            uVar8 = uVar14;
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (bVar7);
        }
        pMesh_00 = local_218;
        if ((long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          fVar16 = 0.0;
          fVar21 = 0.0;
          fVar24 = 0.0;
          fVar26 = 0.0;
          fVar28 = 0.0;
          fVar18 = 0.0;
        }
        else {
          fVar18 = 0.0;
          uVar8 = 0;
          fVar28 = 0.0;
          fVar26 = 0.0;
          fVar24 = 0.0;
          fVar21 = 0.0;
          fVar16 = 0.0;
          do {
            uVar2 = local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar8];
            fVar24 = fVar24 + __s[uVar2].x;
            fVar21 = fVar21 + __s[uVar2].y;
            fVar16 = fVar16 + __s[uVar2].z;
            fVar18 = fVar18 + __s_00[uVar2].x;
            fVar28 = fVar28 + __s_00[uVar2].y;
            fVar26 = fVar26 + __s_00[uVar2].z;
            uVar8 = uVar8 + 1;
          } while ((uVar8 & 0xffffffff) <
                   (ulong)((long)local_298.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_298.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        fVar17 = fVar16 * fVar16 + fVar24 * fVar24 + fVar21 * fVar21;
        local_278._0_4_ = fVar16;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        fVar16 = fVar26 * fVar26 + fVar18 * fVar18 + fVar28 * fVar28;
        if (fVar16 < 0.0) {
          local_29c = fVar17;
          fVar16 = sqrtf(fVar16);
          fVar17 = local_29c;
        }
        else {
          fVar16 = SQRT(fVar16);
        }
        if ((long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          fVar17 = 1.0 / fVar17;
          fVar16 = 1.0 / fVar16;
          uVar8 = 0;
          do {
            uVar2 = local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar8];
            __s[uVar2].x = fVar24 * fVar17;
            __s[uVar2].y = fVar21 * fVar17;
            __s[uVar2].z = (float)local_278._0_4_ * fVar17;
            uVar2 = local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar8];
            __s_00[uVar2].x = fVar18 * fVar16;
            __s_00[uVar2].y = fVar28 * fVar16;
            __s_00[uVar2].z = fVar26 * fVar16;
            uVar8 = uVar8 + 1;
          } while ((uVar8 & 0xffffffff) <
                   (ulong)((long)local_298.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_298.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
        }
      }
      local_2a0 = local_2a0 + 1;
      uVar8 = (ulong)local_2a0;
    } while (local_2a0 < pMesh_00->mNumVertices);
  }
  if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  SpatialSort::~SpatialSort(&local_1e0);
  if ((_Bit_type *)local_1a8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  return true;
}

Assistant:

bool CalcTangentsProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    // we assume that the mesh is still in the verbose vertex format where each face has its own set
    // of vertices and no vertices are shared between faces. Sadly I don't know any quick test to
    // assert() it here.
    // assert( must be verbose, dammit);

    if (pMesh->mTangents) // this implies that mBitangents is also there
        return false;

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Tangents are undefined for line and point meshes");
        return false;
    }

    // what we can check, though, is if the mesh has normals and texture coordinates. That's a requirement
    if( pMesh->mNormals == NULL)
    {
        ASSIMP_LOG_ERROR("Failed to compute tangents; need normals");
        return false;
    }
    if( configSourceUV >= AI_MAX_NUMBER_OF_TEXTURECOORDS || !pMesh->mTextureCoords[configSourceUV] )
    {
        ASSIMP_LOG_ERROR((Formatter::format("Failed to compute tangents; need UV data in channel"),configSourceUV));
        return false;
    }

    const float angleEpsilon = 0.9999f;

    std::vector<bool> vertexDone( pMesh->mNumVertices, false);
    const float qnan = get_qnan();

    // create space for the tangents and bitangents
    pMesh->mTangents = new aiVector3D[pMesh->mNumVertices];
    pMesh->mBitangents = new aiVector3D[pMesh->mNumVertices];

    const aiVector3D* meshPos = pMesh->mVertices;
    const aiVector3D* meshNorm = pMesh->mNormals;
    const aiVector3D* meshTex = pMesh->mTextureCoords[configSourceUV];
    aiVector3D* meshTang = pMesh->mTangents;
    aiVector3D* meshBitang = pMesh->mBitangents;

    // calculate the tangent and bitangent for every face
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // There are less than three indices, thus the tangent vector
            // is not defined. We are finished with these vertices now,
            // their tangent vectors are set to qnan.
            for (unsigned int i = 0; i < face.mNumIndices;++i)
            {
                unsigned int idx = face.mIndices[i];
                vertexDone  [idx] = true;
                meshTang    [idx] = aiVector3D(qnan);
                meshBitang  [idx] = aiVector3D(qnan);
            }

            continue;
        }

        // triangle or polygon... we always use only the first three indices. A polygon
        // is supposed to be planar anyways....
        // FIXME: (thom) create correct calculation for multi-vertex polygons maybe?
        const unsigned int p0 = face.mIndices[0], p1 = face.mIndices[1], p2 = face.mIndices[2];

        // position differences p1->p2 and p1->p3
        aiVector3D v = meshPos[p1] - meshPos[p0], w = meshPos[p2] - meshPos[p0];

        // texture offset p1->p2 and p1->p3
        float sx = meshTex[p1].x - meshTex[p0].x, sy = meshTex[p1].y - meshTex[p0].y;
        float tx = meshTex[p2].x - meshTex[p0].x, ty = meshTex[p2].y - meshTex[p0].y;
        float dirCorrection = (tx * sy - ty * sx) < 0.0f ? -1.0f : 1.0f;
        // when t1, t2, t3 in same position in UV space, just use default UV direction.
        if (  sx * ty == sy * tx ) {
            sx = 0.0; sy = 1.0;
            tx = 1.0; ty = 0.0;
        }

        // tangent points in the direction where to positive X axis of the texture coord's would point in model space
        // bitangent's points along the positive Y axis of the texture coord's, respectively
        aiVector3D tangent, bitangent;
        tangent.x = (w.x * sy - v.x * ty) * dirCorrection;
        tangent.y = (w.y * sy - v.y * ty) * dirCorrection;
        tangent.z = (w.z * sy - v.z * ty) * dirCorrection;
        bitangent.x = (w.x * sx - v.x * tx) * dirCorrection;
        bitangent.y = (w.y * sx - v.y * tx) * dirCorrection;
        bitangent.z = (w.z * sx - v.z * tx) * dirCorrection;

        // store for every vertex of that face
        for( unsigned int b = 0; b < face.mNumIndices; ++b ) {
            unsigned int p = face.mIndices[b];

            // project tangent and bitangent into the plane formed by the vertex' normal
            aiVector3D localTangent = tangent - meshNorm[p] * (tangent * meshNorm[p]);
            aiVector3D localBitangent = bitangent - meshNorm[p] * (bitangent * meshNorm[p]);
            localTangent.NormalizeSafe(); localBitangent.NormalizeSafe();

            // reconstruct tangent/bitangent according to normal and bitangent/tangent when it's infinite or NaN.
            bool invalid_tangent = is_special_float(localTangent.x) || is_special_float(localTangent.y) || is_special_float(localTangent.z);
            bool invalid_bitangent = is_special_float(localBitangent.x) || is_special_float(localBitangent.y) || is_special_float(localBitangent.z);
            if (invalid_tangent != invalid_bitangent) {
                if (invalid_tangent) {
                    localTangent = meshNorm[p] ^ localBitangent;
                    localTangent.NormalizeSafe();
                } else {
                    localBitangent = localTangent ^ meshNorm[p];
                    localBitangent.NormalizeSafe();
                }
            }

            // and write it into the mesh.
            meshTang[ p ]   = localTangent;
            meshBitang[ p ] = localBitangent;
        }
    }


    // create a helper to quickly find locally close vertices among the vertex array
    // FIX: check whether we can reuse the SpatialSort of a previous step
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    float posEpsilon;
    if (shared)
    {
        std::vector<std::pair<SpatialSort,float> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,float>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;;
        }
    }
    if (!vertexFinder)
    {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;

    const float fLimit = std::cos(configMaxAngle);
    std::vector<unsigned int> closeVertices;

    // in the second pass we now smooth out all tangents and bitangents at the same local position
    // if they are not too far off.
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
    {
        if( vertexDone[a])
            continue;

        const aiVector3D& origPos = pMesh->mVertices[a];
        const aiVector3D& origNorm = pMesh->mNormals[a];
        const aiVector3D& origTang = pMesh->mTangents[a];
        const aiVector3D& origBitang = pMesh->mBitangents[a];
        closeVertices.resize( 0 );

        // find all vertices close to that position
        vertexFinder->FindPositions( origPos, posEpsilon, verticesFound);

        closeVertices.reserve (verticesFound.size()+5);
        closeVertices.push_back( a);

        // look among them for other vertices sharing the same normal and a close-enough tangent/bitangent
        for( unsigned int b = 0; b < verticesFound.size(); b++)
        {
            unsigned int idx = verticesFound[b];
            if( vertexDone[idx])
                continue;
            if( meshNorm[idx] * origNorm < angleEpsilon)
                continue;
            if(  meshTang[idx] * origTang < fLimit)
                continue;
            if( meshBitang[idx] * origBitang < fLimit)
                continue;

            // it's similar enough -> add it to the smoothing group
            closeVertices.push_back( idx);
            vertexDone[idx] = true;
        }

        // smooth the tangents and bitangents of all vertices that were found to be close enough
        aiVector3D smoothTangent( 0, 0, 0), smoothBitangent( 0, 0, 0);
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            smoothTangent += meshTang[ closeVertices[b] ];
            smoothBitangent += meshBitang[ closeVertices[b] ];
        }
        smoothTangent.Normalize();
        smoothBitangent.Normalize();

        // and write it back into all affected tangents
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            meshTang[ closeVertices[b] ] = smoothTangent;
            meshBitang[ closeVertices[b] ] = smoothBitangent;
        }
    }
    return true;
}